

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_print_util.c
# Opt level: O2

void libpd_print_concatenator(char *s)

{
  char *__dest;
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  pvVar2 = libpd_mainimp.i_print_util;
  if (libpd_mainimp.i_print_util != (void *)0x0) {
    __dest = (char *)((long)libpd_mainimp.i_print_util + 8);
    *(undefined1 *)
     ((long)libpd_mainimp.i_print_util +
     (long)*(int *)((long)libpd_mainimp.i_print_util + 0x808) + 8) = 0;
    sVar3 = strlen(s);
    iVar4 = *(int *)((long)pvVar2 + 0x808);
    while (iVar1 = (int)sVar3, 0x7ff < iVar4 + iVar1) {
      iVar4 = 0x7ff - iVar4;
      strncat(__dest,s,(long)iVar4);
      (**pvVar2)(__dest);
      *(undefined4 *)((long)pvVar2 + 0x808) = 0;
      s = s + iVar4;
      sVar3 = (size_t)(uint)(iVar1 - iVar4);
      *(undefined1 *)((long)pvVar2 + 8) = 0;
      iVar4 = 0;
    }
    strncat(__dest,s,(long)iVar1);
    iVar4 = *(int *)((long)pvVar2 + 0x808);
    iVar5 = iVar1 + *(int *)((long)pvVar2 + 0x808);
    *(int *)((long)pvVar2 + 0x808) = iVar5;
    if ((iVar5 != 0 && SCARRY4(iVar1,iVar4) == iVar5 < 0) && (__dest[iVar5 - 1] == '\n')) {
      *(undefined1 *)((long)pvVar2 + (ulong)(iVar5 - 1) + 8) = 0;
      (**pvVar2)(__dest);
      *(undefined4 *)((long)pvVar2 + 0x808) = 0;
    }
  }
  return;
}

Assistant:

void libpd_print_concatenator(const char *s) {
  print_util *util = (print_util *)LIBPDSTUFF->i_print_util;
  if (!util) return;

  util->concat_buf[util->concat_len] = '\0';

  int len = (int)strlen(s);
  while (util->concat_len + len >= PRINT_LINE_SIZE) {
    int d = PRINT_LINE_SIZE - 1 - util->concat_len;
    strncat(util->concat_buf, s, d);
    util->concat_printhook(util->concat_buf);
    s += d;
    len -= d;
    util->concat_len = 0;
    util->concat_buf[0] = '\0';
  }

  strncat(util->concat_buf, s, len);
  util->concat_len += len;

  if (util->concat_len > 0 && util->concat_buf[util->concat_len - 1] == '\n') {
    util->concat_buf[util->concat_len - 1] = '\0';
    util->concat_printhook(util->concat_buf);
    util->concat_len = 0;
  }
}